

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reference.cpp
# Opt level: O3

void __thiscall C_A_T_C_H_T_E_S_T_10::foo::func(foo *this,int i)

{
  AssertionHandler catchAssertionHandler;
  undefined4 local_d0;
  int local_cc;
  SourceLineInfo local_c8;
  ITransientExpression local_b8;
  int *local_a8;
  char *local_a0;
  size_t sStack_98;
  undefined4 *local_90;
  AssertionHandler local_88;
  StringRef local_40;
  
  local_b8._vptr_ITransientExpression = (_func_int **)0x1e496b;
  local_b8.m_isBinaryExpression = true;
  local_b8.m_result = false;
  local_b8._10_6_ = 0;
  local_c8.file =
       "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/reference.cpp";
  local_c8.line = 0x129;
  local_cc = i;
  Catch::StringRef::StringRef(&local_40,"i == 0");
  Catch::AssertionHandler::AssertionHandler
            (&local_88,(StringRef *)&local_b8,&local_c8,local_40,Normal);
  local_d0 = 0;
  Catch::StringRef::StringRef((StringRef *)&local_c8,"==");
  local_b8.m_result = i == 0;
  local_b8.m_isBinaryExpression = true;
  local_b8._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_0022f648;
  local_a0 = local_c8.file;
  sStack_98 = local_c8.line;
  local_a8 = &local_cc;
  local_90 = &local_d0;
  Catch::AssertionHandler::handleExpr(&local_88,&local_b8);
  Catch::ITransientExpression::~ITransientExpression(&local_b8);
  Catch::AssertionHandler::complete(&local_88);
  if (local_88.m_completed == false) {
    (*(local_88.m_resultCapture)->_vptr_IResultCapture[0xe])();
  }
  return;
}

Assistant:

void func(int i)
            {
                REQUIRE(i == 0);
            }